

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_visitor.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_json_visitor<wchar_t>::visit_begin_multi_dim
          (basic_json_visitor<wchar_t> *this,
          span<const_unsigned_long,_18446744073709551615UL> *shape,semantic_tag tag,
          ser_context *context,error_code *ec)

{
  size_type sVar1;
  const_iterator puVar2;
  undefined8 in_RCX;
  undefined1 in_DL;
  span<const_unsigned_long,_18446744073709551615UL> *in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  const_iterator it;
  const_iterator local_30;
  
  (**(code **)(*in_RDI + 0x38))(in_RDI,2,in_DL,in_RCX,in_R8);
  sVar1 = detail::span<const_unsigned_long,_18446744073709551615UL>::size(in_RSI);
  (**(code **)(*in_RDI + 0x38))(in_RDI,sVar1,in_DL,in_RCX,in_R8);
  local_30 = detail::span<const_unsigned_long,_18446744073709551615UL>::begin(in_RSI);
  while( true ) {
    puVar2 = detail::span<const_unsigned_long,_18446744073709551615UL>::end(in_RSI);
    if (local_30 == puVar2) break;
    (**(code **)(*in_RDI + 0x78))(in_RDI,*local_30,0,in_RCX,in_R8);
    local_30 = local_30 + 1;
  }
  (**(code **)(*in_RDI + 0x40))(in_RDI,in_RCX,in_R8);
  return true;
}

Assistant:

virtual JSONCONS_VISITOR_RETURN_TYPE visit_begin_multi_dim(const jsoncons::span<const size_t>& shape,
            semantic_tag tag,
            const ser_context& context, 
            std::error_code& ec) 
        {
            visit_begin_array(2, tag, context, ec);
            visit_begin_array(shape.size(), tag, context, ec);
            for (auto it = shape.begin(); it != shape.end(); ++it)
            {
                visit_uint64(*it, semantic_tag::none, context, ec);
            }
            visit_end_array(context, ec);
            JSONCONS_VISITOR_RETURN;
        }